

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall Semantic::SymbolTable::SymbolTable(SymbolTable *this)

{
  Function *this_00;
  string local_b8;
  vector<Variable_*,_std::allocator<Variable_*>_> local_98;
  string local_78;
  vector<Variable_*,_std::allocator<Variable_*>_> local_58;
  
  (this->classes)._M_h._M_buckets = &(this->classes)._M_h._M_single_bucket;
  (this->classes)._M_h._M_bucket_count = 1;
  (this->classes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classes)._M_h._M_element_count = 0;
  (this->classes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->freeFunctions)._M_h._M_buckets = &(this->freeFunctions)._M_h._M_single_bucket;
  (this->freeFunctions)._M_h._M_bucket_count = 1;
  (this->freeFunctions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->freeFunctions)._M_h._M_element_count = 0;
  (this->freeFunctions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->freeFunctions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->freeFunctions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (Function *)operator_new(0xc0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"void","");
  local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Function::Function(this_00,PUBLIC,&local_b8,&local_78,&local_58,&local_98,0);
  if (local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Variable_*,_std::allocator<Variable_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this->main = this_00;
  return;
}

Assistant:

SymbolTable() = default;